

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::DumpReg2Aux
               (OpCode op,OpLayoutReg2Aux *playout,FunctionBody *dumpFunction,ByteCodeReader *reader
               )

{
  code *pcVar1;
  bool bVar2;
  AuxArray<unsigned_int> *pAVar3;
  undefined4 *puVar4;
  undefined6 in_register_0000003a;
  ulong uVar5;
  
  if ((int)CONCAT62(in_register_0000003a,op) != 0x17a) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x62a,"(false)","Unknown OpCode for OpLayoutType::Reg2Aux");
    if (bVar2) {
      *puVar4 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pAVar3 = ByteCodeReader::ReadAuxArray<unsigned_int>
                     ((playout->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset,dumpFunction)
  ;
  Output::Print(L" R%u <- R%u, %u spreadArgs [",(ulong)(playout->super_OpLayoutAuxiliary).R0,
                (ulong)playout->R1,(ulong)pAVar3->count);
  uVar5 = 0;
  do {
    if (pAVar3->count <= uVar5) {
LAB_0074ab72:
      Output::Print(L"]");
      return;
    }
    if (uVar5 != 0) {
      if (uVar5 == 0xb) {
        Output::Print(L", ...");
        goto LAB_0074ab72;
      }
      Output::Print(L", ");
    }
    Output::Print(L"%u",(ulong)pAVar3[uVar5 + 1].count);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void
    ByteCodeDumper::DumpReg2Aux(OpCode op, const unaligned OpLayoutReg2Aux * playout, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
        case Js::OpCode::SpreadArrayLiteral:
        {
            const Js::AuxArray<uint32> *arr = reader.ReadAuxArray<uint32>(playout->Offset, dumpFunction);
            Output::Print(_u(" R%u <- R%u, %u spreadArgs ["), playout->R0, playout->R1, arr->count);
            for (uint i = 0; i < arr->count; i++)
            {
                if (i > 10)
                {
                    Output::Print(_u(", ..."));
                    break;
                }
                if (i != 0)
                {
                    Output::Print(_u(", "));
                }
                Output::Print(_u("%u"), arr->elements[i]);
            }
            Output::Print(_u("]"));
            break;
        }
        default:
            AssertMsg(false, "Unknown OpCode for OpLayoutType::Reg2Aux");
            break;
        }
    }